

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cpp
# Opt level: O0

void __thiscall
icu_63::CheckedArrayByteSink::Append(CheckedArrayByteSink *this,char *bytes,int32_t n)

{
  int iVar1;
  int local_1c;
  int32_t available;
  int32_t n_local;
  char *bytes_local;
  CheckedArrayByteSink *this_local;
  
  if (0 < n) {
    if (0x7fffffff - this->appended_ < n) {
      this->appended_ = 0x7fffffff;
      this->overflowed_ = '\x01';
    }
    else {
      this->appended_ = n + this->appended_;
      iVar1 = this->capacity_ - this->size_;
      local_1c = n;
      if (iVar1 < n) {
        this->overflowed_ = '\x01';
        local_1c = iVar1;
      }
      if ((0 < local_1c) && (bytes != this->outbuf_ + this->size_)) {
        memcpy(this->outbuf_ + this->size_,bytes,(long)local_1c);
      }
      this->size_ = local_1c + this->size_;
    }
  }
  return;
}

Assistant:

void CheckedArrayByteSink::Append(const char* bytes, int32_t n) {
  if (n <= 0) {
    return;
  }
  if (n > (INT32_MAX - appended_)) {
    // TODO: Report as integer overflow, not merely buffer overflow.
    appended_ = INT32_MAX;
    overflowed_ = TRUE;
    return;
  }
  appended_ += n;
  int32_t available = capacity_ - size_;
  if (n > available) {
    n = available;
    overflowed_ = TRUE;
  }
  if (n > 0 && bytes != (outbuf_ + size_)) {
    uprv_memcpy(outbuf_ + size_, bytes, n);
  }
  size_ += n;
}